

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O1

InputStack *
miniscript::internal::operator|(InputStack *__return_storage_ptr__,InputStack a,InputStack b)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  size_t sVar7;
  int *piVar8;
  int *in_RDX;
  int *in_RSI;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *in_RSI;
  if (iVar2 != 0) {
    iVar3 = *in_RDX;
    if ((iVar3 == 0) || ((cVar1 = (char)in_RSI[1], cVar1 == '\0' && ((char)in_RDX[1] == '\x01')))) {
LAB_0073891b:
      uVar6 = *(undefined8 *)in_RSI;
      sVar7 = *(size_t *)(in_RSI + 2);
      __return_storage_ptr__->available = (int)uVar6;
      __return_storage_ptr__->has_sig = (bool)(char)((ulong)uVar6 >> 0x20);
      __return_storage_ptr__->malleable = (bool)(char)((ulong)uVar6 >> 0x28);
      __return_storage_ptr__->non_canon = (bool)(char)((ulong)uVar6 >> 0x30);
      __return_storage_ptr__->field_0x7 = (char)((ulong)uVar6 >> 0x38);
      __return_storage_ptr__->size = sVar7;
      piVar8 = in_RSI + 4;
      iVar2 = in_RSI[5];
      iVar3 = in_RSI[6];
      iVar5 = in_RSI[7];
      *(int *)&(__return_storage_ptr__->stack).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start = in_RSI[4];
      *(int *)((long)&(__return_storage_ptr__->stack).
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4) = iVar2;
      *(int *)&(__return_storage_ptr__->stack).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish = iVar3;
      *(int *)((long)&(__return_storage_ptr__->stack).
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar5;
      in_RDX = in_RSI;
      goto LAB_007389cb;
    }
    if (cVar1 != '\x01' || (char)in_RDX[1] != '\0') {
      if (cVar1 == '\0' && (char)in_RDX[1] == '\0') {
        *(undefined1 *)((long)in_RSI + 5) = 1;
        *(undefined1 *)((long)in_RDX + 5) = 1;
      }
      else {
        if ((*(char *)((long)in_RDX + 5) == '\x01') && (*(char *)((long)in_RSI + 5) == '\0'))
        goto LAB_0073891b;
        if ((*(char *)((long)in_RDX + 5) == '\0') && (*(char *)((long)in_RSI + 5) != '\0'))
        goto LAB_007389b9;
      }
      if (iVar3 == 1 && iVar2 == 1) {
        if (*(ulong *)(in_RSI + 2) <= *(ulong *)(in_RDX + 2)) {
          in_RDX = in_RSI;
        }
      }
      else if (iVar3 == 2 && iVar2 == 2) {
        if (*(ulong *)(in_RDX + 2) <= *(ulong *)(in_RSI + 2)) {
          in_RDX = in_RSI;
        }
      }
      else if (iVar2 == 1) goto LAB_0073891b;
    }
  }
LAB_007389b9:
  uVar6 = *(undefined8 *)in_RDX;
  sVar7 = *(size_t *)(in_RDX + 2);
  __return_storage_ptr__->available = (int)uVar6;
  __return_storage_ptr__->has_sig = (bool)(char)((ulong)uVar6 >> 0x20);
  __return_storage_ptr__->malleable = (bool)(char)((ulong)uVar6 >> 0x28);
  __return_storage_ptr__->non_canon = (bool)(char)((ulong)uVar6 >> 0x30);
  __return_storage_ptr__->field_0x7 = (char)((ulong)uVar6 >> 0x38);
  __return_storage_ptr__->size = sVar7;
  piVar8 = in_RDX + 4;
  iVar2 = in_RDX[5];
  iVar3 = in_RDX[6];
  iVar5 = in_RDX[7];
  *(int *)&(__return_storage_ptr__->stack).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start = in_RDX[4];
  *(int *)((long)&(__return_storage_ptr__->stack).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4) = iVar2;
  *(int *)&(__return_storage_ptr__->stack).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = iVar3;
  *(int *)((long)&(__return_storage_ptr__->stack).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar5;
LAB_007389cb:
  (__return_storage_ptr__->stack).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(in_RDX + 8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  piVar8[0] = 0;
  piVar8[1] = 0;
  piVar8[2] = 0;
  piVar8[3] = 0;
  piVar8[4] = 0;
  piVar8[5] = 0;
  return __return_storage_ptr__;
}

Assistant:

InputStack operator|(InputStack a, InputStack b) {
    // If only one is invalid, pick the other one. If both are invalid, pick an arbitrary one.
    if (a.available == Availability::NO) return b;
    if (b.available == Availability::NO) return a;
    // If only one of the solutions has a signature, we must pick the other one.
    if (!a.has_sig && b.has_sig) return a;
    if (!b.has_sig && a.has_sig) return b;
    if (!a.has_sig && !b.has_sig) {
        // If neither solution requires a signature, the result is inevitably malleable.
        a.malleable = true;
        b.malleable = true;
    } else {
        // If both options require a signature, prefer the non-malleable one.
        if (b.malleable && !a.malleable) return a;
        if (a.malleable && !b.malleable) return b;
    }
    // Between two malleable or two non-malleable solutions, pick the smaller one between
    // YESes, and the bigger ones between MAYBEs. Prefer YES over MAYBE.
    if (a.available == Availability::YES && b.available == Availability::YES) {
        return std::move(a.size <= b.size ? a : b);
    } else if (a.available == Availability::MAYBE && b.available == Availability::MAYBE) {
        return std::move(a.size >= b.size ? a : b);
    } else if (a.available == Availability::YES) {
        return a;
    } else {
        return b;
    }
}